

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::UTF16CollationIterator::forwardNumCodePoints
          (UTF16CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  UChar UVar1;
  bool bVar2;
  UChar32 c;
  UErrorCode *param_2_local;
  int32_t num_local;
  UTF16CollationIterator *this_local;
  
  param_2_local._4_4_ = num;
  while( true ) {
    bVar2 = false;
    if (0 < param_2_local._4_4_) {
      bVar2 = this->pos != this->limit;
    }
    if (!bVar2) break;
    UVar1 = *this->pos;
    if ((UVar1 == L'\0') && (this->limit == (UChar *)0x0)) {
      this->limit = this->pos;
      return;
    }
    this->pos = this->pos + 1;
    param_2_local._4_4_ = param_2_local._4_4_ + -1;
    if ((((UVar1 & 0xfc00U) == 0xd800) && (this->pos != this->limit)) &&
       ((*this->pos & 0xfc00U) == 0xdc00)) {
      this->pos = this->pos + 1;
    }
  }
  return;
}

Assistant:

void
UTF16CollationIterator::forwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    while(num > 0 && pos != limit) {
        UChar32 c = *pos;
        if(c == 0 && limit == NULL) {
            limit = pos;
            break;
        }
        ++pos;
        --num;
        if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(*pos)) {
            ++pos;
        }
    }
}